

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

bool ImNodes::operator==(ImVec2 *a,ImVec2 *b)

{
  if (ABS(a->x - b->x) < 1.1920929e-07) {
    return ABS(a->y - b->y) < 1.1920929e-07;
  }
  return false;
}

Assistant:

bool operator ==(const ImVec2& a, const ImVec2& b)
{
    return abs(a.x - b.x) < std::numeric_limits<float>::epsilon() &&
           abs(a.y - b.y) < std::numeric_limits<float>::epsilon();
}